

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O0

void __thiscall cppnet::RWSocket::OnConnect(RWSocket *this,uint16_t err)

{
  bool bVar1;
  unordered_map<unsigned_long,_std::shared_ptr<cppnet::Socket>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>_>
  *puVar2;
  mapped_type *this_00;
  element_type *this_01;
  shared_ptr<cppnet::RWSocket> local_58;
  undefined1 local_48 [8];
  shared_ptr<cppnet::CppNetBase> cppnet_base;
  undefined1 local_28 [8];
  shared_ptr<cppnet::RWSocket> sock;
  uint16_t err_local;
  RWSocket *this_local;
  
  sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_ =
       err;
  puVar2 = (unordered_map<unsigned_long,_std::shared_ptr<cppnet::Socket>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>_>
            *)__connecting_socket_map();
  std::
  unordered_map<unsigned_long,_std::shared_ptr<cppnet::Socket>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>_>
  ::erase(puVar2,&(this->super_Socket)._sock);
  std::atomic<bool>::operator=(&this->_connecting,false);
  std::enable_shared_from_this<cppnet::RWSocket>::shared_from_this
            ((enable_shared_from_this<cppnet::RWSocket> *)local_28);
  if (sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_
      == 0) {
    puVar2 = (unordered_map<unsigned_long,_std::shared_ptr<cppnet::Socket>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>_>
              *)Socket::__all_socket_map();
    this_00 = std::
              unordered_map<unsigned_long,_std::shared_ptr<cppnet::Socket>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>_>
              ::operator[](puVar2,&(this->super_Socket)._sock);
    std::shared_ptr<cppnet::Socket>::operator=(this_00,(shared_ptr<cppnet::RWSocket> *)local_28);
  }
  std::weak_ptr<cppnet::CppNetBase>::lock((weak_ptr<cppnet::CppNetBase> *)local_48);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
  if (bVar1) {
    this_01 = std::__shared_ptr_access<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_48);
    std::shared_ptr<cppnet::RWSocket>::shared_ptr
              (&local_58,(shared_ptr<cppnet::RWSocket> *)local_28);
    CppNetBase::OnConnect
              (this_01,&local_58,
               sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._6_2_);
    std::shared_ptr<cppnet::RWSocket>::~shared_ptr(&local_58);
  }
  if (sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_
      == 0) {
    (*(this->super_Socket)._vptr_Socket[7])();
  }
  std::shared_ptr<cppnet::CppNetBase>::~shared_ptr((shared_ptr<cppnet::CppNetBase> *)local_48);
  std::shared_ptr<cppnet::RWSocket>::~shared_ptr((shared_ptr<cppnet::RWSocket> *)local_28);
  return;
}

Assistant:

void RWSocket::OnConnect(uint16_t err) {
    __connecting_socket_map.erase(_sock);
    _connecting = false;
    auto sock = shared_from_this();
    if (err == CEC_SUCCESS) {
        __all_socket_map[_sock] = sock;
    }
    
    auto cppnet_base = _cppnet_base.lock();
    if (cppnet_base) {
        cppnet_base->OnConnect(sock, err);
    }

    if (err == CEC_SUCCESS) {
        Read();
    }
}